

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu.h
# Opt level: O3

int basisu::vector_find<basisu::vector<unsigned_int>>
              (vector<unsigned_int> *vec,value_type_conflict *obj)

{
  uint32_t uVar1;
  long lVar2;
  
  uVar1 = vec->m_size;
  if ((long)(int)uVar1 < 0) {
    __assert_fail("vec.size() <= INT_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu.h"
                  ,0xd5,
                  "int basisu::vector_find(const T &, const typename T::value_type &) [T = basisu::vector<unsigned int>]"
                 );
  }
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      if (vec->m_p[lVar2] == *obj) {
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
    } while ((int)uVar1 != lVar2);
  }
  return -1;
}

Assistant:

int vector_find(const T &vec, const typename T::value_type &obj)
	{
		assert(vec.size() <= INT_MAX);
		for (size_t i = 0; i < vec.size(); i++)
			if (vec[i] == obj)
				return static_cast<int>(i);
		return -1;
	}